

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
anon_unknown.dwarf_ae0418::TNoContractionAssigneeCheckingTraverser::
getPrecisenessAndRemainedAccessChain
          (tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,TNoContractionAssigneeCheckingTraverser *this,
          TIntermOperator *node,ObjectAccessChain *precise_object)

{
  unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar1;
  bool bVar2;
  TOperator op;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  long *plVar5;
  TIntermTyped *pTVar6;
  mapped_type *pmVar7;
  undefined4 extraout_var_00;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  bool local_121;
  ObjectAccessChain local_120;
  bool local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  bool local_d1;
  key_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  bool local_a1;
  key_type local_a0;
  long *local_98;
  TIntermUnary *UN;
  undefined4 local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  bool local_59;
  key_type local_58;
  long *local_50;
  TIntermBinary *BN;
  ObjectAccessChain assignee_object;
  ObjectAccessChain *precise_object_local;
  TIntermOperator *node_local;
  TNoContractionAssigneeCheckingTraverser *this_local;
  
  assignee_object.field_2._8_8_ = precise_object;
  op = glslang::TIntermOperator::getOp(node);
  bVar2 = isAssignOperation(op);
  if (!bVar2) {
    __assert_fail("isAssignOperation(node->getOp())",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                  ,0x1eb,
                  "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                 );
  }
  this->precise_object_ = (ObjectAccessChain *)assignee_object.field_2._8_8_;
  std::__cxx11::string::string((string *)&BN);
  iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[8])();
  local_50 = (long *)CONCAT44(extraout_var,iVar3);
  if (local_50 == (long *)0x0) {
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[7])();
    local_98 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (local_98 == (long *)0x0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x213,
                    "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                   );
    }
    puVar1 = this->accesschain_mapping_;
    local_a0 = (key_type)(**(code **)(*local_98 + 0x188))();
    sVar4 = std::
            unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(puVar1,&local_a0);
    if (sVar4 == 0) {
      __assert_fail("accesschain_mapping_.count(UN->getOperand())",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x204,
                    "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                   );
    }
    plVar5 = (long *)(**(code **)(*local_98 + 0x188))();
    (**(code **)(*plVar5 + 0x10))(plVar5,this);
    pTVar6 = (TIntermTyped *)(**(code **)(*local_98 + 0x188))();
    bVar2 = isPreciseObjectNode(pTVar6);
    if (bVar2) {
      local_a1 = true;
      std::__cxx11::string::string((string *)&local_c8);
      std::make_tuple<bool,std::__cxx11::string>(__return_storage_ptr__,&local_a1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      goto LAB_006d57ce;
    }
    puVar1 = this->accesschain_mapping_;
    local_d0 = (key_type)(**(code **)(*local_98 + 0x188))();
    pmVar7 = std::
             unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(puVar1,&local_d0);
    std::__cxx11::string::operator=((string *)&BN,(string *)pmVar7);
  }
  else {
    puVar1 = this->accesschain_mapping_;
    local_58 = (key_type)(**(code **)(*local_50 + 400))();
    sVar4 = std::
            unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(puVar1,&local_58);
    if (sVar4 == 0) {
      __assert_fail("accesschain_mapping_.count(BN->getLeft())",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x1f1,
                    "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                   );
    }
    plVar5 = (long *)(**(code **)(*local_50 + 400))();
    (**(code **)(*plVar5 + 0x10))(plVar5,this);
    pTVar6 = (TIntermTyped *)(**(code **)(*local_50 + 400))();
    bVar2 = isPreciseObjectNode(pTVar6);
    if (bVar2) {
      local_59 = true;
      std::__cxx11::string::string((string *)&local_80);
      std::make_tuple<bool,std::__cxx11::string>(__return_storage_ptr__,&local_59,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      goto LAB_006d57ce;
    }
    puVar1 = this->accesschain_mapping_;
    UN = (TIntermUnary *)(**(code **)(*local_50 + 400))();
    pmVar7 = std::
             unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(puVar1,(key_type *)&UN);
    std::__cxx11::string::operator=((string *)&BN,(string *)pmVar7);
  }
  lVar8 = std::__cxx11::string::find((string *)&BN,assignee_object.field_2._8_8_);
  if (lVar8 == 0) {
    local_d1 = true;
    std::__cxx11::string::string((string *)&local_f8);
    std::make_tuple<bool,std::__cxx11::string>(__return_storage_ptr__,&local_d1,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    lVar8 = std::__cxx11::string::find((string *)assignee_object.field_2._8_8_,(ulong)&BN);
    if (lVar8 == 0) {
      local_f9 = true;
      getSubAccessChainAfterPrefix
                (&local_120,(ObjectAccessChain *)assignee_object.field_2._8_8_,
                 (ObjectAccessChain *)&BN);
      std::make_tuple<bool,std::__cxx11::string>(__return_storage_ptr__,&local_f9,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      local_121 = false;
      std::__cxx11::string::string((string *)&local_148);
      std::make_tuple<bool,std::__cxx11::string>(__return_storage_ptr__,&local_121,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
  }
LAB_006d57ce:
  local_84 = 1;
  std::__cxx11::string::~string((string *)&BN);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, ObjectAccessChain>
    getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator* node,
                                         const ObjectAccessChain& precise_object)
    {
        assert(isAssignOperation(node->getOp()));
        precise_object_ = &precise_object;
        ObjectAccessChain assignee_object;
        if (glslang::TIntermBinary* BN = node->getAsBinaryNode()) {
            // This is a binary assignment node, we need to check the
            // preciseness of the left node.
            assert(accesschain_mapping_.count(BN->getLeft()));
            // The left node (assignee node) is an object node, traverse the
            // node to let the 'precise' of nesting objects being transfered to
            // nested objects.
            BN->getLeft()->traverse(this);
            // After traversing the left node, if the left node is 'precise',
            // we can conclude this assignment should propagate 'precise'.
            if (isPreciseObjectNode(BN->getLeft())) {
                return make_tuple(true, ObjectAccessChain());
            }
            // If the preciseness of the left node (assignee node) can not
            // be determined by now, we need to compare the access chain string
            // of the assignee object with the given precise object.
            assignee_object = accesschain_mapping_.at(BN->getLeft());

        } else if (glslang::TIntermUnary* UN = node->getAsUnaryNode()) {
            // This is a unary assignment node, we need to check the
            // preciseness of the operand node. For unary assignment node, the
            // operand node should always be an object node.
            assert(accesschain_mapping_.count(UN->getOperand()));
            // Traverse the operand node to let the 'precise' being propagated
            // from lower nodes to upper nodes.
            UN->getOperand()->traverse(this);
            // After traversing the operand node, if the operand node is
            // 'precise', this assignment should propagate 'precise'.
            if (isPreciseObjectNode(UN->getOperand())) {
                return make_tuple(true, ObjectAccessChain());
            }
            // If the preciseness of the operand node (assignee node) can not
            // be determined by now, we need to compare the access chain string
            // of the assignee object with the given precise object.
            assignee_object = accesschain_mapping_.at(UN->getOperand());
        } else {
            // Not a binary or unary node, should not happen.
            assert(false);
        }

        // Compare the access chain string of the assignee node with the given
        // precise object to determine if this assignment should propagate
        // 'precise'.
        if (assignee_object.find(precise_object) == 0) {
            // The access chain string of the given precise object is a prefix
            // of assignee's access chain string. The assignee should be
            // 'precise'.
            return make_tuple(true, ObjectAccessChain());
        } else if (precise_object.find(assignee_object) == 0) {
            // The assignee's access chain string is a prefix of the given
            // precise object, the assignee object contains 'precise' object,
            // and we need to pass the remained access chain to the object nodes
            // in the right.
            return make_tuple(true, getSubAccessChainAfterPrefix(precise_object, assignee_object));
        } else {
            // The access chain strings do not match, the assignee object can
            // not be labeled as 'precise' according to the given precise
            // object.
            return make_tuple(false, ObjectAccessChain());
        }
    }